

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  secp256k1_fe *in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_verify_magnitude(in_RSI,(int)((ulong)in_RDX >> 0x20));
  secp256k1_fe_verify_magnitude(in_RSI,(int)((ulong)in_RDX >> 0x20));
  if (in_RDI == in_RDX) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0x155,"test condition failed: r != b");
    abort();
  }
  if (in_RSI == in_RDX) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0x156,"test condition failed: a != b");
    abort();
  }
  secp256k1_fe_impl_mul(in_RSI,in_RDX,(secp256k1_fe *)0x11f0b5);
  in_RDI->magnitude = 1;
  in_RDI->normalized = 0;
  secp256k1_fe_verify(in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 8);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    secp256k1_fe_impl_mul(r, a, b);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}